

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O2

int Llb_CoreReachability(Llb_Img_t *p)

{
  int iVar1;
  Gia_ParLlb_t *pGVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *vStop;
  Vec_Int_t *vStart;
  Aig_Man_t *p_00;
  Vec_Ptr_t *vQuant1;
  Vec_Ptr_t *vQuant0;
  Vec_Ptr_t *local_30;
  Vec_Ptr_t *local_28;
  
  pGVar2 = p->pPars;
  if (pGVar2->fBackward == 0) {
    p_00 = p->pAig;
    pVVar3 = p->vDdMans;
    vStart = p->vVarsCs;
    vStop = p->vVarsNs;
  }
  else {
    Vec_PtrReverseOrder(p->vDdMans);
    pVVar3 = p->vDdMans;
    vStart = p->vVarsNs;
    vStop = p->vVarsCs;
    p_00 = p->pAig;
    pGVar2 = p->pPars;
  }
  pVVar3 = Llb_ImgSupports(p_00,pVVar3,vStart,vStop,0,pGVar2->fVeryVerbose);
  Llb_ImgSchedule(pVVar3,&local_28,&local_30,p->pPars->fVeryVerbose);
  Vec_VecFree((Vec_Vec_t *)pVVar3);
  Llb_ImgQuantifyFirst(p->pAig,p->vDdMans,local_28,p->pPars->fVeryVerbose);
  iVar1 = Llb_CoreReachability_int(p,local_28,local_30);
  Vec_VecFree((Vec_Vec_t *)local_28);
  Vec_VecFree((Vec_Vec_t *)local_30);
  return iVar1;
}

Assistant:

int Llb_CoreReachability( Llb_Img_t * p )
{
    Vec_Ptr_t * vSupps, * vQuant0, * vQuant1;
    int RetValue;
    // get supports and quantified variables
    if ( p->pPars->fBackward )
    {
        Vec_PtrReverseOrder( p->vDdMans );
        vSupps = Llb_ImgSupports( p->pAig, p->vDdMans, p->vVarsNs, p->vVarsCs, 0, p->pPars->fVeryVerbose );
    }
    else
        vSupps = Llb_ImgSupports( p->pAig, p->vDdMans, p->vVarsCs, p->vVarsNs, 0, p->pPars->fVeryVerbose );
    Llb_ImgSchedule( vSupps, &vQuant0, &vQuant1, p->pPars->fVeryVerbose );
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    // remove variables
    Llb_ImgQuantifyFirst( p->pAig, p->vDdMans, vQuant0, p->pPars->fVeryVerbose );
    // perform reachability
    RetValue = Llb_CoreReachability_int( p, vQuant0, vQuant1 );
    Vec_VecFree( (Vec_Vec_t *)vQuant0 );
    Vec_VecFree( (Vec_Vec_t *)vQuant1 );
    return RetValue;
}